

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proitems.h
# Opt level: O2

bool __thiscall ProString::operator==(ProString *this,ProString *other)

{
  bool bVar1;
  long in_FS_OFFSET;
  QStringView local_40;
  QStringView local_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_30.m_data = (this->m_string).d.ptr;
  local_30.m_size = (this->m_string).d.size;
  local_40 = QStringView::mid(&local_30,(long)this->m_offset,(long)this->m_length);
  local_30.m_data = (other->m_string).d.ptr;
  local_30.m_size = (other->m_string).d.size;
  local_30 = QStringView::mid(&local_30,(long)other->m_offset,(long)other->m_length);
  bVar1 = comparesEqual(&local_40,&local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool operator==(const ProString &other) const { return toQStringView() == other.toQStringView(); }